

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O0

int adios2::core::engine::sqlcb_bpdataset(void *p,int argc,char **argv,char **azColName)

{
  char *pcVar1;
  size_t sVar2;
  key_type *__k;
  mapped_type *this;
  undefined8 *in_RDX;
  long in_RDI;
  size_t keyid;
  size_t dirid;
  size_t hostid;
  size_t dsid;
  CampaignBPDataset cds;
  CampaignData *cdp;
  CampaignBPDataset *in_stack_fffffffffffffd28;
  CampaignBPDataset *in_stack_fffffffffffffd30;
  allocator *this_00;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  size_t local_1c0;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  key_type *local_168;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  size_t local_110;
  allocator local_101;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  size_t local_a8;
  string local_a0 [32];
  string local_80 [32];
  long local_60;
  long local_58;
  bool local_50;
  long local_48;
  long local_28;
  undefined8 *local_18;
  
  local_28 = in_RDI;
  local_18 = in_RDX;
  CampaignBPDataset::CampaignBPDataset(in_stack_fffffffffffffd30);
  pcVar1 = (char *)*local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"SQL callback convert text to int",&local_101);
  sVar2 = helper::StringToSizeT(&in_stack_fffffffffffffd30->uuid,&in_stack_fffffffffffffd28->uuid);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pcVar1 = (char *)local_18[1];
  local_a8 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar1,&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"SQL callback convert text to int",&local_159);
  sVar2 = helper::StringToSizeT(&in_stack_fffffffffffffd30->uuid,&in_stack_fffffffffffffd28->uuid);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pcVar1 = (char *)local_18[2];
  local_110 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,pcVar1,&local_189);
  this_00 = &local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"SQL callback convert text to int",this_00);
  __k = (key_type *)
        helper::StringToSizeT(&in_stack_fffffffffffffd30->uuid,&in_stack_fffffffffffffd28->uuid);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  local_60 = local_110 - 1;
  local_58 = (long)__k - 1;
  local_168 = __k;
  std::__cxx11::string::operator=(local_80,(char *)local_18[3]);
  local_50 = false;
  local_48 = 0;
  if (0.2 <= *(double *)(local_28 + 0x30)) {
    pcVar1 = (char *)local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,pcVar1,&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"SQL callback convert text to int",&local_209);
    sVar2 = helper::StringToSizeT(&in_stack_fffffffffffffd30->uuid,&in_stack_fffffffffffffd28->uuid)
    ;
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    local_50 = sVar2 != 0;
    local_48 = sVar2 - 1;
    local_1c0 = sVar2;
  }
  if (0.3 <= *(double *)(local_28 + 0x30)) {
    pcVar1 = (char *)local_18[5];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,pcVar1,&local_231);
    std::__cxx11::string::operator=(local_a0,local_230);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  this = std::
         map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
         ::operator[]((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
                       *)this_00,__k);
  CampaignBPDataset::operator=(this,in_stack_fffffffffffffd28);
  CampaignBPDataset::~CampaignBPDataset(this);
  return 0;
}

Assistant:

static int sqlcb_bpdataset(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    CampaignBPDataset cds;
    size_t dsid = helper::StringToSizeT(std::string(argv[0]), "SQL callback convert text to int");
    size_t hostid = helper::StringToSizeT(std::string(argv[1]), "SQL callback convert text to int");
    size_t dirid = helper::StringToSizeT(std::string(argv[2]), "SQL callback convert text to int");
    cds.hostIdx = hostid - 1; // SQL rows start from 1, vector idx start from 0
    cds.dirIdx = dirid - 1;   // SQL rows start from 1, vector idx start from 0
    cds.name = argv[3];

    cds.hasKey = false;
    cds.keyIdx = 0;
    if (cdp->version.version >= 0.2)
    {
        size_t keyid =
            helper::StringToSizeT(std::string(argv[4]), "SQL callback convert text to int");
        cds.hasKey = (keyid); // keyid == 0 means there is no key used
        cds.keyIdx = size_t(keyid - 1);
    }
    if (cdp->version.version >= 0.3)
    {
        cds.uuid = std::string(argv[5]);
    }
    cdp->bpdatasets[dsid] = cds;
    return 0;
}